

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O1

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  uchar *puVar1;
  cJSON_bool cVar2;
  int iVar3;
  cJSON *pcVar4;
  cJSON *pcVar5;
  cJSON *pcVar6;
  uchar *__s;
  char *pcVar7;
  uchar *puVar8;
  uchar *puVar9;
  uint uVar10;
  uchar *pointer;
  uint uVar11;
  bool bVar12;
  size_t index;
  size_t local_38;
  
  if (case_sensitive == 0) {
    pcVar4 = cJSON_GetObjectItem(patch,"path");
  }
  else {
    pcVar4 = cJSON_GetObjectItemCaseSensitive(patch,"path");
  }
  cVar2 = cJSON_IsString(pcVar4);
  if (cVar2 == 0) {
    uVar11 = 2;
LAB_001050bb:
    pcVar5 = (cJSON *)0x0;
  }
  else {
    if (case_sensitive == 0) {
      pcVar5 = cJSON_GetObjectItem(patch,"op");
    }
    else {
      pcVar5 = cJSON_GetObjectItemCaseSensitive(patch,"op");
    }
    cVar2 = cJSON_IsString(pcVar5);
    if (cVar2 == 0) {
      uVar10 = 0;
    }
    else {
      pcVar7 = pcVar5->valuestring;
      iVar3 = strcmp(pcVar7,"add");
      if (iVar3 == 0) {
        uVar10 = 1;
      }
      else {
        iVar3 = strcmp(pcVar7,"remove");
        if (iVar3 == 0) {
          uVar10 = 2;
        }
        else {
          iVar3 = strcmp(pcVar7,"replace");
          if (iVar3 == 0) {
            uVar10 = 3;
          }
          else {
            iVar3 = strcmp(pcVar7,"move");
            if (iVar3 == 0) {
              uVar10 = 4;
            }
            else {
              iVar3 = strcmp(pcVar7,"copy");
              if (iVar3 == 0) {
                uVar10 = 5;
              }
              else {
                iVar3 = strcmp(pcVar7,"test");
                uVar10 = 6;
                if (iVar3 != 0) {
                  uVar10 = 0;
                }
              }
            }
          }
        }
      }
    }
    if (uVar10 == 0) {
      uVar11 = 3;
      goto LAB_001050bb;
    }
    if (uVar10 == 6) {
      pcVar4 = get_item_from_pointer(object,pcVar4->valuestring,case_sensitive);
      if (case_sensitive == 0) {
        pcVar5 = cJSON_GetObjectItem(patch,"value");
      }
      else {
        pcVar5 = cJSON_GetObjectItemCaseSensitive(patch,"value");
      }
      cVar2 = compare_json(pcVar4,pcVar5,case_sensitive);
      uVar11 = (uint)(cVar2 == 0);
      goto LAB_001050bb;
    }
    if (*pcVar4->valuestring == '\0') {
      if (uVar10 == 2) {
        overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
LAB_00105110:
        __s = (uchar *)0x0;
        uVar11 = 0;
        pcVar4 = (cJSON *)0x0;
        goto LAB_001050c1;
      }
      if ((uVar10 & 0xfffffffd) != 1) goto LAB_00105052;
      pcVar4 = get_object_item(patch,"value",case_sensitive);
      if (pcVar4 != (cJSON *)0x0) {
        pcVar4 = cJSON_Duplicate(pcVar4,1);
        uVar11 = 0;
        if (pcVar4 != (cJSON *)0x0) {
          overwrite_item(object,*pcVar4);
          cJSON_free(pcVar4);
          if (object->string == (char *)0x0) goto LAB_001050bb;
          cJSON_free(object->string);
          object->string = (char *)0x0;
          goto LAB_00105110;
        }
        goto LAB_00105240;
      }
LAB_0010524b:
      uVar11 = 7;
      goto LAB_001050bb;
    }
LAB_00105052:
    uVar11 = 0;
    if ((uVar10 & 0xfffffffe) == 2) {
      pcVar5 = detach_path(object,(uchar *)pcVar4->valuestring,case_sensitive);
      uVar11 = 0;
      if (pcVar5 == (cJSON *)0x0) {
        uVar11 = 0xd;
      }
      else {
        cJSON_Delete(pcVar5);
      }
      if (pcVar5 == (cJSON *)0x0 || uVar10 == 2) goto LAB_001050bb;
    }
    if ((uVar10 & 0xfffffffe) != 4) {
      if (case_sensitive == 0) {
        pcVar5 = cJSON_GetObjectItem(patch,"value");
      }
      else {
        pcVar5 = cJSON_GetObjectItemCaseSensitive(patch,"value");
      }
      if (pcVar5 == (cJSON *)0x0) goto LAB_0010524b;
      pcVar5 = cJSON_Duplicate(pcVar5,1);
      if (pcVar5 == (cJSON *)0x0) {
LAB_00105240:
        uVar11 = 8;
        goto LAB_001050bb;
      }
LAB_001052bd:
      __s = cJSONUtils_strdup((uchar *)pcVar4->valuestring);
      pcVar7 = strrchr((char *)__s,0x2f);
      if (pcVar7 == (char *)0x0) {
        pointer = (uchar *)0x0;
      }
      else {
        *pcVar7 = '\0';
        pointer = (uchar *)(pcVar7 + 1);
      }
      pcVar6 = get_item_from_pointer(object,(char *)__s,case_sensitive);
      puVar8 = pointer;
      puVar9 = pointer;
      if (pointer != (uchar *)0x0) {
        do {
          if (*puVar9 == '~') {
            puVar1 = puVar9 + 1;
            puVar9 = puVar9 + 1;
            if (*puVar1 == '1') {
              puVar8[1] = '/';
            }
            else {
              if (*puVar1 != '0') break;
              *puVar8 = '~';
            }
          }
          else if (*puVar9 == '\0') goto LAB_00105334;
          puVar8 = puVar8 + 1;
          puVar9 = puVar9 + 1;
        } while( true );
      }
      goto LAB_00105337;
    }
    if (case_sensitive == 0) {
      pcVar6 = cJSON_GetObjectItem(patch,"from");
    }
    else {
      pcVar6 = cJSON_GetObjectItemCaseSensitive(patch,"from");
    }
    if (pcVar6 == (cJSON *)0x0) {
      uVar10 = 4;
LAB_001052b0:
      pcVar5 = (cJSON *)0x0;
      bVar12 = false;
    }
    else {
      if (uVar10 == 4) {
        pcVar5 = detach_path(object,(uchar *)pcVar6->valuestring,case_sensitive);
      }
      else {
        pcVar5 = (cJSON *)0x0;
      }
      if (uVar10 == 5) {
        pcVar5 = get_item_from_pointer(object,pcVar6->valuestring,case_sensitive);
      }
      if (pcVar5 == (cJSON *)0x0) {
        uVar10 = 5;
        goto LAB_001052b0;
      }
      if (uVar10 == 5) {
        pcVar5 = cJSON_Duplicate(pcVar5,1);
      }
      bVar12 = pcVar5 != (cJSON *)0x0;
      uVar10 = 6;
      if (bVar12) {
        uVar10 = uVar11;
      }
    }
    uVar11 = uVar10;
    if (bVar12) goto LAB_001052bd;
  }
  __s = (uchar *)0x0;
  pcVar4 = pcVar5;
LAB_001050c1:
  if (pcVar4 != (cJSON *)0x0) {
    cJSON_Delete(pcVar4);
  }
  if (__s != (uchar *)0x0) {
    cJSON_free(__s);
  }
  return uVar11;
LAB_00105334:
  *puVar8 = '\0';
LAB_00105337:
  pcVar4 = pcVar5;
  if (pcVar6 == (cJSON *)0x0 || pointer == (uchar *)0x0) {
    uVar11 = 9;
  }
  else {
    cVar2 = cJSON_IsArray(pcVar6);
    if (cVar2 == 0) {
      cVar2 = cJSON_IsObject(pcVar6);
      if (cVar2 == 0) goto LAB_001050c1;
      if (case_sensitive == 0) {
        cJSON_DeleteItemFromObject(pcVar6,(char *)pointer);
      }
      else {
        cJSON_DeleteItemFromObjectCaseSensitive(pcVar6,(char *)pointer);
      }
      cJSON_AddItemToObject(pcVar6,(char *)pointer,pcVar5);
    }
    else {
      iVar3 = strcmp((char *)pointer,"-");
      if (iVar3 != 0) {
        local_38 = 0;
        cVar2 = decode_array_index_from_pointer(pointer,&local_38);
        if (cVar2 == 0) {
          uVar11 = 0xb;
        }
        else {
          cVar2 = insert_item_in_array(pcVar6,local_38,pcVar5);
          pcVar4 = (cJSON *)0x0;
          if (cVar2 == 0) {
            uVar11 = 10;
            pcVar4 = pcVar5;
          }
        }
        goto LAB_001050c1;
      }
      cJSON_AddItemToArray(pcVar6,pcVar5);
    }
    pcVar4 = (cJSON *)0x0;
  }
  goto LAB_001050c1;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}